

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O2

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  Module *this_00;
  __uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> _Var1;
  uintptr_t uVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Name name_00;
  Name name_01;
  Name name_02;
  char *pcVar5;
  undefined1 auVar6 [8];
  size_t params_00;
  Type *pTVar7;
  Function *pFVar8;
  Export *pEVar9;
  Table *pTVar10;
  CallIndirect *pCVar11;
  undefined8 in_RCX;
  Type params_01;
  MixedArena *this_01;
  int __val;
  Index IVar12;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar13;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var14;
  bool bVar15;
  Signature sig_00;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar16;
  Name NVar17;
  Iterator IVar18;
  Name name_03;
  Name name_04;
  undefined1 auStack_298 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_108;
  HeapType funcType_local;
  HeapType local_f8;
  Type local_f0;
  LocalGet *local_e8;
  LocalGet *local_e0;
  undefined1 auStack_d8 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Builder local_b0;
  Builder builder;
  undefined1 local_a0 [8];
  Signature sig;
  undefined1 local_88 [8];
  Name name;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  Iterator __begin1_1;
  
  local_108.id = funcType.id;
  _local_a0 = (Expression)HeapType::getSignature(&local_108);
  bVar15 = local_a0._8_8_.id < 7;
  params_01.id = CONCAT71((int7)((ulong)in_RCX >> 8),bVar15);
  if (((undefined1  [16])_local_a0 & (undefined1  [16])0x1) != (undefined1  [16])0x0 && !bVar15) {
    Fatal::Fatal((Fatal *)auStack_298);
    std::operator<<((ostream *)
                    &args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                    "GenerateDynCalls: Cannot operate on multiple return values:");
    Fatal::operator<<((Fatal *)auStack_298,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_298);
  }
  if (this->onlyI64 == true) {
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _auStack_298 = (string_view)_local_a0;
    name.super_IString.str._M_str = (char *)&args;
    PVar16 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)&args);
    pvVar13 = &args;
    for (; PVar3.index = (size_t)namedParams.
                                 super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
        PVar3.parent = (Type *)pvVar13, PVar16 != PVar3;
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)&((namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                              _M_len + 1)) {
      pTVar7 = wasm::Type::Iterator::operator*((Iterator *)&name.super_IString.str._M_str);
      if (pTVar7->id == 3) goto LAB_009ebde4;
      pvVar13 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                name.super_IString.str._M_str;
    }
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    name.super_IString.str._M_str = (char *)auStack_298;
    PVar16 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::end((Type *)auStack_298);
    pTVar7 = (Type *)auStack_298;
    for (; PVar4.index = (size_t)namedParams.
                                 super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                 ._M_impl.super__Vector_impl_data._M_start, PVar4.parent = pTVar7,
        PVar16 != PVar4;
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)&((namedParams.
                                super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                              _M_len + 1)) {
      pTVar7 = wasm::Type::Iterator::operator*((Iterator *)&name.super_IString.str._M_str);
      if (pTVar7->id == 3) goto LAB_009ebde4;
      pTVar7 = (Type *)name.super_IString.str._M_str;
    }
  }
  else {
LAB_009ebde4:
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
              ).
              super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>
              .super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
              currModule;
    local_b0.wasm = this_00;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name.super_IString.str._M_str,"dynCall_",(allocator<char> *)&f);
    getSig_abi_cxx11_((string *)auStack_d8,(wasm *)sig.params.id,(Type)local_a0,params_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &name.super_IString.str._M_str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_d8);
    IString::IString((IString *)local_88,(string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_298);
    std::__cxx11::string::~string((string *)auStack_d8);
    std::__cxx11::string::~string((string *)&name.super_IString.str._M_str);
    NVar17.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
    NVar17.super_IString.str._M_len = (size_t)local_88;
    pFVar8 = Module::getFunctionOrNull(this_00,NVar17);
    if ((pFVar8 == (Function *)0x0) &&
       (name_00.super_IString.str._M_str = (char *)name.super_IString.str._M_len,
       name_00.super_IString.str._M_len = (size_t)local_88,
       pEVar9 = Module::getExportOrNull(this_00,name_00), pEVar9 == (Export *)0x0)) {
      name.super_IString.str._M_str = (char *)0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_d8 = (undefined1  [8])0x0;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      builder.wasm = (Module *)
                     (this_00->tables).
                     super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (builder.wasm ==
          (Module *)
          (this_00->tables).
          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        NVar17 = Name::fromInt(0);
        wasm::Type::Type((Type *)&funcType_local,(HeapType)0x10,Nullable,Inexact);
        name_03.super_IString.str._M_str = NVar17.super_IString.str._M_len;
        name_03.super_IString.str._M_len = (size_t)auStack_298;
        Builder::makeTable(name_03,(Type)NVar17.super_IString.str._M_str,(Address)funcType_local.id,
                           (Address)0x0,(Type)0xffffffff);
        pTVar10 = Module::addTable(this_00,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                            *)auStack_298);
        std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr
                  ((unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)auStack_298);
        pcVar5 = DAT_01174c48;
        (pTVar10->super_Importable).module.super_IString.str._M_len = ENV;
        (pTVar10->super_Importable).module.super_IString.str._M_str = pcVar5;
        Name::Name((Name *)auStack_298,"__indirect_function_table");
        (pTVar10->super_Importable).base.super_IString.str._M_len = (size_t)auStack_298;
        (pTVar10->super_Importable).base.super_IString.str._M_str =
             (char *)args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        (pTVar10->addressType).id =
             *(uintptr_t *)
              ((long)(((this_00->memories).
                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t +
              0x50);
        builder.wasm = (Module *)
                       (this_00->tables).
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
      emplace_back<char_const(&)[5],wasm::Type&>
                ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)
                 &name.super_IString.str._M_str,(char (*) [5])"fptr",
                 &((_Head_base<0UL,_wasm::Table_*,_false> *)
                  &((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl->addressType);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8,
                 &((_Head_base<0UL,_wasm::Table_*,_false> *)
                  &((builder.wasm)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_head_impl->addressType);
      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           local_a0;
      IVar18 = wasm::Type::end((Type *)local_a0);
      sig.results.id =
           (uintptr_t)
           IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      __val = 0;
      while ((params_00 = name.super_IString.str._M_len, auVar6 = local_88,
             __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
             != (Type *)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index ||
             (f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
              (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
              sig.results.id))) {
        pTVar7 = wasm::Type::Iterator::operator*((Iterator *)&f);
        std::__cxx11::to_string((string *)auStack_298,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)
                   &name.super_IString.str._M_str,(string *)auStack_298,pTVar7);
        std::__cxx11::string::~string((string *)auStack_298);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8,pTVar7);
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
        __val = __val + 1;
      }
      wasm::Type::Type(&local_f0,(Tuple *)auStack_d8);
      sig_00.results.id = sig.params.id;
      sig_00.params.id = local_f0.id;
      HeapType::HeapType(&local_f8,sig_00);
      _auStack_298 = (string_view)ZEXT816(0);
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      name_04.super_IString.str._M_str = (char *)auVar6;
      name_04.super_IString.str._M_len = (size_t)&local_50;
      Builder::makeFunction
                (name_04,(vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)params_00,
                 (HeapType)&name.super_IString.str._M_str,
                 (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_f8.id,
                 (Expression *)auStack_298);
      std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
                ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_298);
      *(bool *)((long)local_50._M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = true;
      _Var1.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
           ((builder.wasm)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[9]._M_t.
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>;
      this_01 = &(local_b0.wasm)->allocator;
      local_e0 = MixedArena::alloc<wasm::LocalGet>(this_01);
      local_e0->index = 0;
      (local_e0->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
           (uintptr_t)
           _Var1.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      _auStack_298 = (string_view)ZEXT816(0);
      args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           local_a0;
      IVar18 = wasm::Type::end((Type *)local_a0);
      sig.results.id =
           (uintptr_t)
           IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
      IVar12 = 1;
      _Var14._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
           (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)local_a0;
      while ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
              != (Type *)IVar18.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                         index ||
             (_Var14._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
              (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)sig.results.id))) {
        pTVar7 = wasm::Type::Iterator::operator*((Iterator *)&f);
        uVar2 = pTVar7->id;
        local_e8 = MixedArena::alloc<wasm::LocalGet>(this_01);
        local_e8->index = IVar12;
        (local_e8->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             uVar2;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_298,
                   (Expression **)&local_e8);
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
        IVar12 = IVar12 + 1;
        _Var14._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
             (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
             (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)f;
      }
      pCVar11 = Builder::
                makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                          (&local_b0,
                           (IString)*(IString *)
                                     &(((builder.wasm)->exports).
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t,
                           (Expression *)local_e0,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           auStack_298,local_108,false);
      *(CallIndirect **)
       ((long)local_50._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = pCVar11;
      Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                   *)&local_50);
      name_02.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
      name_02.super_IString.str._M_len = (size_t)local_88;
      name_01.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
      name_01.super_IString.str._M_len = (size_t)local_88;
      pFVar8 = Module::getFunctionOrNull(this_00,name_01);
      if (pFVar8 == (Function *)0x0) {
        __assert_fail("!must_export",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GenerateDynCalls.cpp"
                      ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
      }
      pEVar9 = Module::getExportOrNull(this_00,name_02);
      if (pEVar9 == (Export *)0x0) {
        pEVar9 = (Export *)operator_new(0x30);
        (pEVar9->name).super_IString.str._M_len = (size_t)local_88;
        (pEVar9->name).super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        pEVar9->kind = Function;
        *(undefined1 (*) [8])
         &(pEVar9->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u = local_88;
        *(size_t *)
         ((long)&(pEVar9->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) =
             name.super_IString.str._M_len;
        *(__index_type *)
         ((long)&(pEVar9->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = '\0';
        Module::addExport(this_00,pEVar9);
      }
      std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 auStack_298);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
                ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_50);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_d8);
      std::_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>::~_Vector_base
                ((_Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                 &name.super_IString.str._M_str);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
    table->addressType = wasm->memories[0]->addressType;
  }
  auto& table = wasm->tables[0];
  namedParams.emplace_back("fptr",
                           table->addressType); // function pointer param
  params.push_back(table->addressType);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  f->hasExplicitName = true;
  Expression* fptr = builder.makeLocalGet(0, table->addressType);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  f->body = builder.makeCallIndirect(table->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}